

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O0

int32_t __thiscall
DeviceTy::data_submit(DeviceTy *this,void *TgtPtrBegin,void *HstPtrBegin,int64_t Size)

{
  int32_t iVar1;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  size_t unaff_retaddr;
  void *in_stack_00000008;
  void *in_stack_00000010;
  int32_t result;
  
  _ZTW14ompt_interface();
  OmptInterface::target_data_submit_begin
            ((OmptInterface *)HstPtrBegin,Size,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  iVar1 = (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                    (*(undefined4 *)(in_RDI + 0x10),in_RSI,in_RDX,in_RCX);
  _ZTW14ompt_interface();
  OmptInterface::target_data_submit_end
            ((OmptInterface *)HstPtrBegin,Size,in_stack_00000010,in_stack_00000008,unaff_retaddr);
  return iVar1;
}

Assistant:

int32_t DeviceTy::data_submit(void *TgtPtrBegin, void *HstPtrBegin,
    int64_t Size) {
  DP("enter DeviceTy::data_submit\n");
  ompt_interface.target_data_submit_begin(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  int32_t result = RTL->data_submit(RTLDeviceID, TgtPtrBegin, HstPtrBegin, Size); 
  ompt_interface.target_data_submit_end(DeviceID, TgtPtrBegin, HstPtrBegin, Size);
  DP("exit DeviceTy::data_submit\n");
  return result;
}